

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall front::irGenerator::irGenerator::pushWhile(irGenerator *this,WhileLabels wl)

{
  WhileLabels local_8;
  
  local_8 = wl;
  std::vector<front::irGenerator::WhileLabels,_std::allocator<front::irGenerator::WhileLabels>_>::
  push_back(&this->_whileStack,&local_8);
  return;
}

Assistant:

void irGenerator::pushWhile(WhileLabels wl) { _whileStack.push_back(wl); }